

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  xmlChar *__dest;
  xmlChar *pxVar4;
  uint uVar5;
  uint uVar6;
  xmlChar *pxVar7;
  int l;
  xmlChar buf [105];
  int local_c0;
  uint local_bc;
  size_t local_b8;
  xmlChar **local_b0;
  xmlChar local_a8 [120];
  
  pxVar7 = *str;
  uVar5 = 10000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar5 = 50000;
  }
  iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&local_c0);
  iVar2 = xmlIsNameStartChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
  if (iVar2 != 0) {
    local_bc = uVar5;
    if (iVar1 < 0x80) {
      local_a8[0] = (xmlChar)iVar1;
      uVar5 = 1;
    }
    else {
      uVar5 = xmlCopyCharMultiByte(local_a8,iVar1);
    }
    pxVar7 = pxVar7 + local_c0;
    iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&local_c0);
    do {
      iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
      if (iVar2 == 0) {
        if ((int)local_bc < (int)uVar5) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
          return (xmlChar *)0x0;
        }
        *str = pxVar7;
        pxVar7 = xmlStrndup(local_a8,uVar5);
        if (pxVar7 != (xmlChar *)0x0) {
          return pxVar7;
        }
        goto LAB_00141f13;
      }
      if (iVar1 < 0x80) {
        local_a8[(int)uVar5] = (xmlChar)iVar1;
        uVar5 = uVar5 + 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(local_a8 + (int)uVar5,iVar1);
        uVar5 = uVar5 + iVar1;
      }
      pxVar7 = pxVar7 + local_c0;
      iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&local_c0);
    } while ((int)uVar5 < 100);
    local_b0 = str;
    __dest = (xmlChar *)(*xmlMalloc)((ulong)(uVar5 * 2));
    if (__dest == (xmlChar *)0x0) {
LAB_00141f13:
      xmlCtxtErrMemory(ctxt);
    }
    else {
      memcpy(__dest,local_a8,(ulong)uVar5);
      iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
      local_b8 = (ulong)(uVar5 * 2);
      while( true ) {
        if (iVar2 == 0) {
          __dest[(int)uVar5] = '\0';
          *local_b0 = pxVar7;
          return __dest;
        }
        iVar2 = (int)local_b8;
        pxVar4 = __dest;
        if (iVar2 < (int)(uVar5 + 10)) break;
LAB_00141e88:
        if (iVar1 < 0x80) {
          uVar6 = uVar5 + 1;
          pxVar4[(int)uVar5] = (xmlChar)iVar1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(pxVar4 + (int)uVar5,iVar1);
          uVar6 = iVar1 + uVar5;
        }
        pxVar7 = pxVar7 + local_c0;
        iVar1 = xmlStringCurrentChar(ctxt,pxVar7,&local_c0);
        iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
        __dest = pxVar4;
        uVar5 = uVar6;
      }
      if (iVar2 < 1) {
        local_b8 = 1;
LAB_00141e69:
        pxVar4 = (xmlChar *)(*xmlRealloc)(__dest,local_b8);
        if (pxVar4 != (xmlChar *)0x0) goto LAB_00141e88;
        xmlCtxtErrMemory(ctxt);
      }
      else {
        if (iVar2 < (int)local_bc) {
          uVar3 = iVar2 + 1U >> 1;
          uVar6 = uVar3 + iVar2;
          if ((int)(local_bc - uVar3) < iVar2) {
            uVar6 = local_bc;
          }
          local_b8 = (size_t)uVar6;
          goto LAB_00141e69;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
      }
      (*xmlFree)(__dest);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *ret;
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_TEXT_LENGTH :
                    XML_MAX_NAME_LENGTH;

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(buf, len, c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(buf, len, c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, maxLength);
                    if (newSize < 0) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
                        xmlFree(buffer);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
                    max = newSize;
		}
		COPY_BUF(buffer, len, c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if (len > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlErrMemory(ctxt);
    return(ret);
}